

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.cpp
# Opt level: O0

int __thiscall
CVmConsole::read_event_script
          (CVmConsole *this,int *evt,char *buf,size_t buflen,int *filter,int filter_cnt,
          unsigned_long *attrs)

{
  int iVar1;
  char *in_RDX;
  int *in_RSI;
  osfildef *in_RDI;
  long in_R8;
  int in_R9D;
  unsigned_long *in_stack_00000008;
  int found;
  int i;
  osfildef *fp;
  CVmConsole *in_stack_000000a8;
  osfildef *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  char *buf_00;
  undefined4 in_stack_ffffffffffffffc8;
  int local_4;
  
  if ((in_RDI->_IO_write_base == (char *)0x0) || (*(int *)(in_RDI->_IO_write_base + 0x24) == 0)) {
    local_4 = 0;
  }
  else {
    buf_00 = *(char **)(in_RDI->_IO_write_base + 0x10);
    while( true ) {
      while (iVar1 = read_script_event_type((CVmConsole *)fp,_found,in_stack_00000008), iVar1 == 0)
      {
        iVar1 = close_script_file(in_stack_000000a8);
        (**(code **)(*(long *)in_RDI + 0x20))(in_RDI,iVar1);
        if (in_RDI->_IO_write_base == (char *)0x0) {
          return 0;
        }
        buf_00 = *(char **)(in_RDI->_IO_write_base + 0x10);
      }
      if (in_R8 == 0) break;
      in_stack_ffffffffffffffb8 = 0;
      for (in_stack_ffffffffffffffbc = 0; in_stack_ffffffffffffffbc < in_R9D;
          in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc + 1) {
        if (*(int *)(in_R8 + (long)in_stack_ffffffffffffffbc * 4) == *in_RSI) {
          in_stack_ffffffffffffffb8 = 1;
          break;
        }
      }
      if (in_stack_ffffffffffffffb8 != 0) break;
      skip_script_line((CVmConsole *)in_RDI,in_stack_ffffffffffffffa8);
    }
    if (in_RDX == (char *)0x0) {
      skip_script_line((CVmConsole *)in_RDI,in_stack_ffffffffffffffa8);
    }
    else {
      iVar1 = read_script_param((CVmConsole *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),buf_00,
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI
                               );
      if (iVar1 == 0) {
        return 0;
      }
      if (*in_RSI == 1) {
        iVar1 = strcmp(in_RDX,"[enter]");
        if (iVar1 == 0) {
          strcpy(in_RDX,"\n");
        }
        else {
          iVar1 = strcmp(in_RDX,"[tab]");
          if (iVar1 == 0) {
            strcpy(in_RDX,"\t");
          }
          else {
            iVar1 = strcmp(in_RDX,"[space]");
            if (iVar1 == 0) {
              strcpy(in_RDX," ");
            }
          }
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int CVmConsole::read_event_script(VMG_ int *evt, char *buf, size_t buflen,
                                  const int *filter, int filter_cnt,
                                  unsigned long *attrs)
{
    /* 
     *   if we're not reading a script, or it's not an event script, skip
     *   this 
     */
    if (script_sp_ == 0 || !script_sp_->event_script)
        return FALSE;

    /* get the script file */
    osfildef *fp = script_sp_->fp;

    /* keep going until we find something */
    for (;;)
    {
        /* read the next event */
        if (!read_script_event_type(evt, attrs))
        {
            /* end of the script - close it */
            set_more_state(close_script_file(vmg0_));

            /* if there's no more script file, there's no event */
            if (script_sp_ == 0)
                return FALSE;

            /* go back for the next event */
            fp = script_sp_->fp;
            continue;
        }

        /* if it's not in the filter list, skip it */
        if (filter != 0)
        {
            int i, found;

            /* look for a match in our filter list */
            for (i = 0, found = FALSE ; i < filter_cnt ; ++i)
            {
                if (filter[i] == *evt)
                {
                    found = TRUE;
                    break;
                }
            }

            /* if we didn't find it, skip this line */
            if (!found)
            {
                skip_script_line(fp);
                continue;
            }
        }

        /* if there's a buffer, read the rest of the line */
        if (buf != 0)
        {
            /* read the parameter into the buffer, and return the result */
            if (!read_script_param(buf, buflen, fp))
                return FALSE;

            /* if this is an OS_EVT_KEY event, translate special keys */
            if (*evt == OS_EVT_KEY)
            {
                if (strcmp(buf, "[enter]") == 0)
                    strcpy(buf, "\n");
                else if (strcmp(buf, "[tab]") == 0)
                    strcpy(buf, "\t");
                else if (strcmp(buf, "[space]") == 0)
                    strcpy(buf, " ");
            }
        }
        else
        {
            /* no result buffer - just skip anything left on the line */
            skip_script_line(fp);
        }

        /* success */
        return TRUE;
    }
}